

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::CapturedStream::GetCapturedString_abi_cxx11_
          (string *__return_storage_ptr__,CapturedStream *this)

{
  char *path;
  ostream *poVar1;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *file_00;
  GTestLog local_24;
  FILE *local_20;
  FILE *file;
  CapturedStream *this_local;
  string *content;
  
  file = (FILE *)this;
  this_local = (CapturedStream *)__return_storage_ptr__;
  if (this->uncaptured_fd_ != -1) {
    fflush((FILE *)0x0);
    dup2(this->uncaptured_fd_,this->fd_);
    close(this->uncaptured_fd_);
    this->uncaptured_fd_ = -1;
  }
  path = (char *)std::__cxx11::string::c_str();
  local_20 = posix::FOpen(path,"r");
  file_00 = extraout_RDX;
  if (local_20 == (FILE *)0x0) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/googletest/googletest/src/gtest-port.cc"
                       ,0x46f);
    poVar1 = GTestLog::GetStream(&local_24);
    poVar1 = std::operator<<(poVar1,"Failed to open tmp file ");
    poVar1 = std::operator<<(poVar1,(string *)&this->filename_);
    std::operator<<(poVar1," for capturing stream.");
    GTestLog::~GTestLog(&local_24);
    file_00 = extraout_RDX_00;
  }
  ReadEntireFile_abi_cxx11_(__return_storage_ptr__,(internal *)local_20,file_00);
  posix::FClose(local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(nullptr);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    if (file == nullptr) {
      GTEST_LOG_(FATAL) << "Failed to open tmp file " << filename_
                        << " for capturing stream.";
    }
    const std::string content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }